

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O1

void __thiscall Ptex::v2_2::PtexReader::Level::Level(Level *this,int nfaces)

{
  size_type __n;
  allocator_type local_1b;
  allocator_type local_1a;
  allocator_type local_19;
  
  __n = (size_type)nfaces;
  std::vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::vector
            (&this->fdh,__n,&local_19);
  std::vector<long,_std::allocator<long>_>::vector(&this->offsets,__n,&local_1a);
  std::
  vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>::
  vector(&this->faces,__n,&local_1b);
  return;
}

Assistant:

Level(int nfaces)
            : fdh(nfaces),
              offsets(nfaces),
              faces(nfaces) {}